

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_strmatch_fuzzy_text(char *str,int str_len,char *pattern,int *out_score)

{
  char cVar1;
  char cVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  
  iVar5 = 0;
  if (pattern != (char *)0x0 && (str_len != 0 && str != (char *)0x0)) {
    if (str_len < 1) {
      iVar11 = 0;
    }
    else {
      bVar19 = true;
      lVar12 = 0;
      iVar11 = 0;
      bVar4 = 0;
      bVar15 = false;
      uVar9 = 0;
      pcVar8 = (char *)0x0;
      pcVar13 = pattern;
      do {
        cVar1 = *pcVar13;
        iVar5 = (int)cVar1;
        cVar2 = *str;
        iVar14 = (int)cVar2;
        if (cVar1 == '\0') {
          bVar16 = false;
        }
        else {
          iVar3 = iVar5 + -0xa2;
          if (0x19 < iVar5 - 0x41U) {
            iVar3 = iVar5;
          }
          iVar6 = iVar14 + -0xa2;
          if (0x19 < iVar14 - 0x41U) {
            iVar6 = iVar14;
          }
          bVar16 = iVar3 == iVar6;
        }
        if (pcVar8 == (char *)0x0) {
          bVar17 = false;
        }
        else {
          iVar6 = (int)*pcVar8;
          iVar3 = iVar6 + -0xa2;
          if (0x19 < iVar6 - 0x41U) {
            iVar3 = iVar6;
          }
          iVar6 = iVar14 + -0xa2;
          if (0x19 < iVar14 - 0x41U) {
            iVar6 = iVar14;
          }
          bVar17 = iVar3 == iVar6;
        }
        bVar18 = false;
        if ((pcVar8 != (char *)0x0) && (bVar18 = false, cVar1 != '\0')) {
          iVar6 = (int)*pcVar8;
          iVar3 = iVar6 + -0xa2;
          if (0x19 < iVar6 - 0x41U) {
            iVar3 = iVar6;
          }
          iVar6 = iVar5 + -0xa2;
          if (0x19 < iVar5 - 0x41U) {
            iVar6 = iVar5;
          }
          bVar18 = iVar3 == iVar6;
        }
        if ((pcVar8 != (char *)0x0 & bVar16) != 0 || bVar18) {
          pcVar8 = (char *)0x0;
          uVar10 = uVar9;
          uVar9 = 0;
        }
        else {
          uVar10 = 0;
        }
        iVar11 = uVar10 + iVar11;
        if ((bVar17 | bVar16) == 1) {
          if (pcVar13 == pattern) {
            iVar5 = -9;
            if (-9 < (int)lVar12) {
              iVar5 = (int)lVar12;
            }
            iVar11 = iVar11 + iVar5;
          }
          uVar10 = (uint)bVar4 * 5 + 10;
          if (!bVar19) {
            uVar10 = (uint)bVar4 * 5;
          }
          uVar7 = uVar10 + 10;
          if (iVar14 - 0x5bU < 0xffffffe6) {
            uVar7 = uVar10;
          }
          if (!bVar15) {
            uVar7 = uVar10;
          }
          pcVar13 = pcVar13 + bVar16;
          bVar19 = pcVar8 != (char *)0x0;
          if (uVar9 <= uVar7) {
            pcVar8 = str;
          }
          bVar15 = uVar9 <= uVar7;
          if (uVar7 <= uVar9) {
            uVar7 = uVar9;
          }
          uVar9 = uVar7;
          iVar11 = iVar11 - (uint)(bVar15 && bVar19);
          bVar4 = 1;
        }
        else {
          iVar11 = iVar11 + -1;
          bVar4 = 0;
        }
        bVar15 = iVar14 - 0x61U < 0x1a;
        bVar19 = cVar2 == ' ' || cVar2 == '_';
        lVar12 = lVar12 + -3;
        str = str + 1;
      } while ((ulong)(uint)str_len * 3 + lVar12 != 0);
      if (pcVar8 == (char *)0x0) {
        uVar9 = 0;
      }
      iVar11 = iVar11 + uVar9;
      pattern = pcVar13;
    }
    iVar5 = 0;
    if ((*pattern == '\0') && (iVar5 = 1, out_score != (int *)0x0)) {
      *out_score = iVar11;
    }
  }
  return iVar5;
}

Assistant:

NK_API int
nk_strmatch_fuzzy_text(const char *str, int str_len,
    const char *pattern, int *out_score)
{
    /* Returns true if each character in pattern is found sequentially within str
     * if found then outScore is also set. Score value has no intrinsic meaning.
     * Range varies with pattern. Can only compare scores with same search pattern. */

    /* ------- scores --------- */
    /* bonus for adjacent matches */
    #define NK_ADJACENCY_BONUS 5
    /* bonus if match occurs after a separator */
    #define NK_SEPARATOR_BONUS 10
    /* bonus if match is uppercase and prev is lower */
    #define NK_CAMEL_BONUS 10
    /* penalty applied for every letter in str before the first match */
    #define NK_LEADING_LETTER_PENALTY (-3)
    /* maximum penalty for leading letters */
    #define NK_MAX_LEADING_LETTER_PENALTY (-9)
    /* penalty for every letter that doesn't matter */
    #define NK_UNMATCHED_LETTER_PENALTY (-1)

    /* loop variables */
    int score = 0;
    char const * pattern_iter = pattern;
    int str_iter = 0;
    int prev_matched = nk_false;
    int prev_lower = nk_false;
    /* true so if first letter match gets separator bonus*/
    int prev_separator = nk_true;

    /* use "best" matched letter if multiple string letters match the pattern */
    char const * best_letter = 0;
    int best_letter_score = 0;

    /* loop over strings */
    NK_ASSERT(str);
    NK_ASSERT(pattern);
    if (!str || !str_len || !pattern) return 0;
    while (str_iter < str_len)
    {
        const char pattern_letter = *pattern_iter;
        const char str_letter = str[str_iter];

        int next_match = *pattern_iter != '\0' &&
            nk_to_lower(pattern_letter) == nk_to_lower(str_letter);
        int rematch = best_letter && nk_to_lower(*best_letter) == nk_to_lower(str_letter);

        int advanced = next_match && best_letter;
        int pattern_repeat = best_letter && *pattern_iter != '\0';
        pattern_repeat = pattern_repeat &&
            nk_to_lower(*best_letter) == nk_to_lower(pattern_letter);

        if (advanced || pattern_repeat) {
            score += best_letter_score;
            best_letter = 0;
            best_letter_score = 0;
        }

        if (next_match || rematch)
        {
            int new_score = 0;
            /* Apply penalty for each letter before the first pattern match */
            if (pattern_iter == pattern) {
                int count = (int)(&str[str_iter] - str);
                int penalty = NK_LEADING_LETTER_PENALTY * count;
                if (penalty < NK_MAX_LEADING_LETTER_PENALTY)
                    penalty = NK_MAX_LEADING_LETTER_PENALTY;

                score += penalty;
            }

            /* apply bonus for consecutive bonuses */
            if (prev_matched)
                new_score += NK_ADJACENCY_BONUS;

            /* apply bonus for matches after a separator */
            if (prev_separator)
                new_score += NK_SEPARATOR_BONUS;

            /* apply bonus across camel case boundaries */
            if (prev_lower && nk_is_upper(str_letter))
                new_score += NK_CAMEL_BONUS;

            /* update pattern iter IFF the next pattern letter was matched */
            if (next_match)
                ++pattern_iter;

            /* update best letter in str which may be for a "next" letter or a rematch */
            if (new_score >= best_letter_score) {
                /* apply penalty for now skipped letter */
                if (best_letter != 0)
                    score += NK_UNMATCHED_LETTER_PENALTY;

                best_letter = &str[str_iter];
                best_letter_score = new_score;
            }
            prev_matched = nk_true;
        } else {
            score += NK_UNMATCHED_LETTER_PENALTY;
            prev_matched = nk_false;
        }

        /* separators should be more easily defined */
        prev_lower = nk_is_lower(str_letter) != 0;
        prev_separator = str_letter == '_' || str_letter == ' ';

        ++str_iter;
    }

    /* apply score for last match */
    if (best_letter)
        score += best_letter_score;

    /* did not match full pattern */
    if (*pattern_iter != '\0')
        return nk_false;

    if (out_score)
        *out_score = score;
    return nk_true;
}